

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O1

void __thiscall soplex::CLUFactorRational::colSingletons(CLUFactorRational *this)

{
  int iVar1;
  int iVar2;
  int p_col;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  pointer pnVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int *piVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  
  if (0 < (this->temp).stage) {
    piVar4 = (this->row).orig;
    piVar5 = (this->row).perm;
    piVar6 = (this->temp).s_mark;
    lVar16 = 0;
    do {
      iVar1 = piVar4[lVar16];
      lVar21 = (long)(this->u).row.len[iVar1];
      if (0 < lVar21) {
        iVar2 = (this->u).row.start[iVar1];
        piVar7 = (this->u).row.idx;
        lVar23 = 0;
        do {
          p_col = piVar7[iVar2 + lVar23];
          piVar8 = (this->u).col.idx;
          piVar9 = (this->u).col.start;
          piVar10 = (this->u).col.len;
          piVar11 = (this->temp).s_cact;
          iVar19 = (piVar10[p_col] + piVar9[p_col]) - piVar11[p_col];
          piVar13 = piVar8 + iVar19;
          do {
            piVar20 = piVar13;
            piVar13 = piVar20 + 1;
          } while (*piVar20 != iVar1);
          *piVar20 = piVar8[iVar19];
          piVar8[iVar19] = iVar1;
          iVar19 = piVar11[p_col];
          piVar11[p_col] = iVar19 + -1;
          if (iVar19 == 2) {
            iVar19 = piVar10[p_col];
            piVar10[p_col] = iVar19 + -1;
            iVar19 = piVar8[(long)piVar9[p_col] + (long)iVar19 + -1];
            if (-1 < piVar5[iVar19]) goto LAB_001b0096;
            piVar8 = (this->u).row.len;
            iVar18 = piVar8[iVar19] + -1;
            iVar3 = (this->u).row.start[iVar19];
            piVar8[iVar19] = iVar18;
            lVar17 = (long)(iVar3 + iVar18);
            lVar14 = lVar17 * 0x40 + 0x40;
            lVar15 = lVar17 * 4;
            do {
              lVar24 = lVar15;
              lVar22 = lVar14;
              lVar14 = lVar22 + -0x40;
              lVar15 = lVar24 + -4;
            } while (*(int *)((long)(this->u).row.idx + lVar24) != p_col);
            setPivot(this,(this->temp).stage,p_col,iVar19,
                     (Rational *)
                     ((long)&(this->u).row.val.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value +
                     lVar22));
            iVar19 = (this->temp).stage;
            (this->temp).stage = iVar19 + 1;
            piVar6[iVar19] = p_col;
            pnVar12 = (this->u).row.val.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&pnVar12[-1].m_backend.m_value + lVar22),
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)(pnVar12 + lVar17));
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&pnVar12[-1].m_backend.m_value + lVar22 + 0x20),
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)((long)&pnVar12[lVar17].m_backend.m_value + 0x20));
            piVar8 = (this->u).row.idx;
            *(int *)((long)piVar8 + lVar24) = piVar8[lVar17];
          }
          else if (iVar19 == 1) {
LAB_001b0096:
            this->stat = SINGULAR;
            return;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 != lVar21);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (this->temp).stage);
  }
  return;
}

Assistant:

inline void CLUFactorRational::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               stat = SLinSolverRational::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            stat = SLinSolverRational::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}